

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.h
# Opt level: O2

void __thiscall
TPZSYsmpMatrix<std::complex<double>_>::CopyFrom
          (TPZSYsmpMatrix<std::complex<double>_> *this,TPZMatrix<std::complex<double>_> *mat)

{
  TPZSYsmpMatrix<std::complex<double>_> *copy;
  
  if (mat != (TPZMatrix<std::complex<double>_> *)0x0) {
    copy = (TPZSYsmpMatrix<std::complex<double>_> *)
           __dynamic_cast(mat,&TPZMatrix<std::complex<double>>::typeinfo,
                          &TPZSYsmpMatrix<std::complex<double>>::typeinfo,0);
    if (copy != (TPZSYsmpMatrix<std::complex<double>_> *)0x0) {
      operator=(this,copy);
      return;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZSYsmpMatrix<std::complex<double>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = std::complex<double>]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
  std::operator<<((ostream *)&std::cerr,"Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzsysmp.h",
             0x37);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZSYsmpMatrix<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }